

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_range.cc
# Opt level: O2

void re2c::UTF16addContinuous1(RangeSuffix **root,uint32_t l,uint32_t h)

{
  RangeSuffix *pRVar1;
  
  while( true ) {
    pRVar1 = *root;
    if (pRVar1 == (RangeSuffix *)0x0) {
      pRVar1 = (RangeSuffix *)operator_new(0x18);
      RangeSuffix::RangeSuffix(pRVar1,l,h);
      *root = pRVar1;
      return;
    }
    if ((pRVar1->l == l) && (pRVar1->h == h)) break;
    root = &pRVar1->next;
  }
  return;
}

Assistant:

void UTF16addContinuous1(RangeSuffix * & root, uint32_t l, uint32_t h)
{
	RangeSuffix ** p = &root;
	for (;;)
	{
		if (*p == NULL)
		{
			*p = new RangeSuffix(l, h);
			break;
		}
		else if ((*p)->l == l && (*p)->h == h)
		{
			break;
		}
		else
			p = &(*p)->next;
	}
}